

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

vector<int,_false,_5> __thiscall
immutable::vector<int,_false,_5>::insert
          (vector<int,_false,_5> *this,size_type_conflict pos,value_type_conflict value)

{
  vector<int,_false,_5> local_40;
  vector<int,_false,_5> local_38;
  vector<int,_false,_5> local_30;
  
  take(&local_30,pos);
  push_back(&local_38,(value_type_conflict)&local_30);
  drop(&local_40,pos);
  operator+((immutable *)this,&local_38,&local_40);
  ref<immutable::rrb<int,_false,_5>_>::~ref(&local_40._impl);
  ref<immutable::rrb<int,_false,_5>_>::~ref(&local_38._impl);
  ref<immutable::rrb<int,_false,_5>_>::~ref(&local_30._impl);
  return (vector<int,_false,_5>)(ref<immutable::rrb<int,_false,_5>_>)this;
}

Assistant:

vector insert(size_type pos, value_type value) const
        {        
        return take(pos).push_back(value) + drop(pos);
        }